

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uxsel.c
# Opt level: O2

void uxsel_set(int fd,int rwx,uxsel_callback_fn callback)

{
  undefined8 in_RAX;
  int *e;
  uxsel_id *puVar1;
  
  if (fd < 0) {
    __assert_fail("fd >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/uxsel.c",
                  0x43,"void uxsel_set(int, int, uxsel_callback_fn)");
  }
  uxsel_del((int)((ulong)in_RAX >> 0x20));
  if (rwx != 0) {
    e = (int *)safemalloc(1,0x18,0);
    *e = fd;
    e[1] = rwx;
    *(uxsel_callback_fn *)(e + 2) = callback;
    puVar1 = uxsel_input_add(fd,rwx);
    *(uxsel_id **)(e + 4) = puVar1;
    add234(fds,e);
    return;
  }
  return;
}

Assistant:

void uxsel_set(int fd, int rwx, uxsel_callback_fn callback)
{
    struct fd *newfd;

    assert(fd >= 0);

    uxsel_del(fd);

    if (rwx) {
        newfd = snew(struct fd);
        newfd->fd = fd;
        newfd->rwx = rwx;
        newfd->callback = callback;
        newfd->id = uxsel_input_add(fd, rwx);
        add234(fds, newfd);
    }
}